

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CEditor::SortImages(CEditor *this)

{
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *other;
  CEditorImage **ppCVar1;
  CEditorImage *pCVar2;
  int *piVar3;
  int iVar4;
  CEditorImage **__buffer;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  pair<CEditorImage_**,_long> pVar9;
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (1 < (this->m_Map).m_lImages.num_elements) {
    other = &(this->m_Map).m_lImages;
    lVar8 = 1;
    do {
      ppCVar1 = other->list;
      iVar4 = str_comp(ppCVar1[lVar8]->m_aName,ppCVar1[lVar8 + -1]->m_aName);
      if (iVar4 < 0) {
        array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::array(&local_40,other);
        uVar7 = (ulong)local_40.num_elements;
        uVar5 = 0xffffffffffffffff;
        if (-1 < (long)uVar7) {
          uVar5 = uVar7 * 4;
        }
        gs_pSortedIndex = (int *)operator_new__(uVar5);
        lVar8 = (long)(this->m_Map).m_lImages.num_elements;
        if (lVar8 != 0) {
          ppCVar1 = (this->m_Map).m_lImages.list;
          pVar9 = std::get_temporary_buffer<CEditorImage*>
                            ((long)(int)((lVar8 - (lVar8 + 1 >> 0x3f)) + 1U >> 1));
          lVar6 = pVar9.second;
          __buffer = pVar9.first;
          if (__buffer == (CEditorImage **)0x0) {
            lVar6 = 0;
            std::
            __inplace_stable_sort<CEditorImage**,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(CEditorImage_const*,CEditorImage_const*)>>
                      (ppCVar1,ppCVar1 + lVar8,
                       (_Iter_comp_iter<int_(*)(const_CEditorImage_*,_const_CEditorImage_*)>)
                       0x19ac6d);
          }
          else {
            std::
            __stable_sort_adaptive<CEditorImage**,CEditorImage**,long,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(CEditorImage_const*,CEditorImage_const*)>>
                      (ppCVar1,ppCVar1 + lVar8,__buffer,lVar6,
                       (_Iter_comp_iter<int_(*)(const_CEditorImage_*,_const_CEditorImage_*)>)
                       0x19ac6d);
          }
          operator_delete(__buffer,lVar6 << 3);
          uVar7 = (ulong)(uint)local_40.num_elements;
        }
        piVar3 = gs_pSortedIndex;
        if (0 < (int)uVar7) {
          iVar4 = (this->m_Map).m_lImages.num_elements;
          ppCVar1 = (this->m_Map).m_lImages.list;
          lVar8 = 0;
          do {
            if (0 < iVar4) {
              pCVar2 = local_40.list[lVar8];
              lVar6 = 0;
              do {
                if (pCVar2 == ppCVar1[lVar6]) {
                  piVar3[lVar8] = (int)lVar6;
                  iVar4 = (this->m_Map).m_lImages.num_elements;
                }
                lVar6 = lVar6 + 1;
              } while (lVar6 < iVar4);
              uVar7 = (ulong)(uint)local_40.num_elements;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (int)uVar7);
        }
        CEditorMap::ModifyImageIndex(&this->m_Map,ModifySortedIndex);
        if (gs_pSortedIndex != (int *)0x0) {
          operator_delete__(gs_pSortedIndex);
        }
        gs_pSortedIndex = (int *)0x0;
        if (local_40.list != (CEditorImage **)0x0) {
          operator_delete__(local_40.list);
        }
        break;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->m_Map).m_lImages.num_elements);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::SortImages()
{
	bool Sorted = true;
	for(int i = 1; i < m_Map.m_lImages.size(); i++)
		if(*m_Map.m_lImages[i] < *m_Map.m_lImages[i-1])
		{
			Sorted = false;
			break;
		}

	if(!Sorted)
	{
		array<CEditorImage*> lTemp = array<CEditorImage*>(m_Map.m_lImages);
		gs_pSortedIndex = new int[lTemp.size()];

		std::stable_sort(&m_Map.m_lImages[0], &m_Map.m_lImages[m_Map.m_lImages.size()], CompareImage);

		for(int OldIndex = 0; OldIndex < lTemp.size(); OldIndex++)
			for(int NewIndex = 0; NewIndex < m_Map.m_lImages.size(); NewIndex++)
				if(lTemp[OldIndex] == m_Map.m_lImages[NewIndex])
					gs_pSortedIndex[OldIndex] = NewIndex;

		m_Map.ModifyImageIndex(ModifySortedIndex);

		delete [] gs_pSortedIndex;
		gs_pSortedIndex = 0;
	}
}